

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ast.cpp
# Opt level: O2

void __thiscall Ast::print_recursive(Ast *this,Node *current_node,size_t level)

{
  Ast *this_00;
  size_t sVar1;
  string *this_01;
  bool bVar2;
  allocator local_379;
  Ast *local_378;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (current_node == (Node *)0x0) {
    return;
  }
  sVar1 = level;
  local_378 = this;
  while (bVar2 = sVar1 != 0, sVar1 = sVar1 - 1, bVar2) {
    std::__cxx11::string::string((string *)&local_50,"  ",&local_379);
    cout_log(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::string((string *)&local_b0,"+-",&local_379);
  cout_log(&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  switch(current_node->type) {
  case PROG:
    std::__cxx11::string::string((string *)&local_d0,"PROG",&local_379);
    cout_log(&local_d0);
    this_01 = &local_d0;
    break;
  case EXPR:
    std::__cxx11::string::string((string *)&local_f0,"EXPR",&local_379);
    cout_log(&local_f0);
    this_01 = &local_f0;
    break;
  case DCLRT:
    std::__cxx11::string::string((string *)&local_110,"DCLRT",&local_379);
    cout_log(&local_110);
    this_01 = &local_110;
    break;
  case SEQ:
    std::__cxx11::string::string((string *)&local_130,"SEQ",&local_379);
    cout_log(&local_130);
    this_01 = &local_130;
    break;
  case SET:
    std::__cxx11::string::string((string *)&local_150,"SET",&local_379);
    cout_log(&local_150);
    this_01 = &local_150;
    break;
  case IF:
    std::__cxx11::string::string((string *)&local_170,"IF",&local_379);
    cout_log(&local_170);
    this_01 = &local_170;
    break;
  case ELSE:
    std::__cxx11::string::string((string *)&local_190,"ELSE",&local_379);
    cout_log(&local_190);
    this_01 = &local_190;
    break;
  case FOR:
    std::__cxx11::string::string((string *)&local_1b0,"FOR",&local_379);
    cout_log(&local_1b0);
    this_01 = &local_1b0;
    break;
  case VARIABLE:
    std::__cxx11::string::string((string *)&local_1d0,"VARIABLE ",&local_379);
    cout_log(&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::string((string *)&local_1f0,"(",&local_379);
    cout_log(&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::string((string *)&local_70,(string *)current_node);
    cout_log(&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string((string *)&local_210,")",&local_379);
    cout_log(&local_210);
    this_01 = &local_210;
    break;
  case NUMBER:
    std::__cxx11::string::string((string *)&local_230,"NUMBER ",&local_379);
    cout_log(&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::string((string *)&local_250,"(",&local_379);
    cout_log(&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::string((string *)&local_90,(string *)current_node);
    cout_log(&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::string((string *)&local_270,")",&local_379);
    cout_log(&local_270);
    this_01 = &local_270;
    break;
  case MORE:
    std::__cxx11::string::string((string *)&local_290,"MORE",&local_379);
    cout_log(&local_290);
    this_01 = &local_290;
    break;
  case LESS:
    std::__cxx11::string::string((string *)&local_2b0,"LESS",&local_379);
    cout_log(&local_2b0);
    this_01 = &local_2b0;
    break;
  case EQUALITY:
    std::__cxx11::string::string((string *)&local_2d0,"EQUALITY",&local_379);
    cout_log(&local_2d0);
    this_01 = &local_2d0;
    break;
  case ADD:
    std::__cxx11::string::string((string *)&local_2f0,"ADD",&local_379);
    cout_log(&local_2f0);
    this_01 = &local_2f0;
    break;
  case SUB:
    std::__cxx11::string::string((string *)&local_310,"SUB",&local_379);
    cout_log(&local_310);
    this_01 = &local_310;
    break;
  case MUL:
    std::__cxx11::string::string((string *)&local_330,"MUL",&local_379);
    cout_log(&local_330);
    this_01 = &local_330;
    break;
  case DIV:
    std::__cxx11::string::string((string *)&local_350,"DIV",&local_379);
    cout_log(&local_350);
    this_01 = &local_350;
    break;
  case PRINTLN:
    std::__cxx11::string::string((string *)&local_370,"PRINTLN",&local_379);
    cout_log(&local_370);
    this_01 = &local_370;
    break;
  default:
    goto switchD_00102c77_default;
  }
  std::__cxx11::string::~string((string *)this_01);
switchD_00102c77_default:
  endl_log();
  this_00 = local_378;
  sVar1 = level + 1;
  print_recursive(local_378,current_node->operand1,sVar1);
  print_recursive(this_00,current_node->operand2,sVar1);
  print_recursive(this_00,current_node->operand3,sVar1);
  print_recursive(this_00,current_node->operand4,sVar1);
  return;
}

Assistant:

void Ast::print_recursive(Node* current_node, size_t level)
{
	if (current_node == nullptr) {
		return;
	}

	for (int i = 0; i < level; ++i) {
		cout_log("  ");
	}

	cout_log("+-");

	switch (current_node->type){
		case node_type::PROG:{
			cout_log("PROG");
			break;
		}
		case node_type::EXPR:{
			cout_log("EXPR");
			break;
		}
		case node_type::DCLRT: {
			cout_log("DCLRT");
			break;
		}
		case node_type::SEQ: {
			cout_log("SEQ");
			break;
		}
		case node_type::SET: {
			cout_log("SET");
			break;
		}
		case node_type::IF: {
			cout_log("IF");
			break;
		}
		case node_type::ELSE: {
			cout_log("ELSE");
			break;
		}
		case node_type::FOR: {
			cout_log("FOR");
			break;
		}
		case node_type::VARIABLE: {
			cout_log("VARIABLE ");
			cout_log("(");
			cout_log(current_node->value);
			cout_log(")");
			break;
		}
		case node_type::NUMBER:{
			cout_log("NUMBER ");
			cout_log("(");
			cout_log(current_node->value);
			cout_log(")");
			break;
		}
		case node_type::MORE: {
			cout_log("MORE");
			break;
		}
		case node_type::LESS: {
			cout_log("LESS");
			break;
		}
		case node_type::EQUALITY: {
			cout_log("EQUALITY");
			break;
		}
		case node_type::ADD:{
			cout_log("ADD");
			break;
		}
		case node_type::SUB:{
			cout_log("SUB");
			break;
		}
		case node_type::MUL:{
			cout_log("MUL");
			break;
		}
		case node_type::DIV:{
			cout_log("DIV");
			break;
		}
		case node_type::PRINTLN: {
			cout_log("PRINTLN");
			break;
		}
	}

	endl_log();

	print_recursive(current_node->operand1, level + 1);
	print_recursive(current_node->operand2, level + 1);
	print_recursive(current_node->operand3, level + 1);
	print_recursive(current_node->operand4, level + 1);

}